

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgEnc.c
# Opt level: O0

void zvgEnc(int xStart,int yStart,int xEnd,int yEnd)

{
  undefined1 auVar1 [16];
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  uchar uVar7;
  byte bVar8;
  uchar uVar9;
  uchar uVar10;
  byte bVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  int diff;
  uint zvgCmd;
  uint vRatio;
  uint ySign;
  uint xSign;
  uint yLen;
  uint xLen;
  int yEnd_local;
  int xEnd_local;
  int yStart_local;
  int xStart_local;
  
  ZvgENC.vecCount = ZvgENC.vecCount + 1;
  xLen = xEnd;
  xEnd_local = xStart;
  if ((ZvgENC.encFlags & 1) != 0) {
    xEnd_local = xStart ^ 0xffffffff;
    xLen = xEnd ^ 0xffffffff;
  }
  yLen = yEnd;
  yEnd_local = yStart;
  if ((ZvgENC.encFlags & 2) != 0) {
    yEnd_local = yStart ^ 0xffffffff;
    yLen = yEnd ^ 0xffffffff;
  }
  if (((xEnd_local == xLen) || (yEnd_local == yLen)) ||
     (iVar12 = clipLine(&xEnd_local,&yEnd_local,(int *)&xLen,(int *)&yLen), iVar12 != 0)) {
    if ((xEnd_local == xLen) && (yEnd_local == yLen)) {
      if ((((ZvgENC.xMinClip <= xEnd_local) && (xEnd_local <= ZvgENC.xMaxClip)) &&
          (ZvgENC.yMinClip <= yEnd_local)) && (yEnd_local <= ZvgENC.yMaxClip)) {
        zvgEncPointSK(xEnd_local,yEnd_local,ZvgENC.encColor);
      }
    }
    else {
      bVar8 = 0x10;
      if (ZvgENC.encColor != ZvgENC.zColor) {
        bVar8 = 0x50;
      }
      if ((xEnd_local != ZvgENC.xPos) || (yEnd_local != ZvgENC.yPos)) {
        bVar8 = bVar8 | 0x80;
      }
      if (xEnd_local <= (int)xLen) {
        xSign = xLen - xEnd_local;
      }
      else {
        xSign = xEnd_local - xLen;
      }
      bVar5 = xEnd_local > (int)xLen;
      if (yEnd_local <= (int)yLen) {
        ySign = yLen - yEnd_local;
      }
      else {
        ySign = yEnd_local - yLen;
      }
      bVar6 = yEnd_local > (int)yLen;
      uVar7 = (uchar)yEnd_local;
      bVar3 = (byte)((uint)yEnd_local >> 8);
      if (ySign == 0) {
        if (yEnd_local < ZvgENC.yMinClip) {
          return;
        }
        if (ZvgENC.yMaxClip < yEnd_local) {
          return;
        }
        if (bVar5) {
          if (ZvgENC.xMaxClip < (int)xLen) {
            return;
          }
          if (xEnd_local < ZvgENC.xMinClip) {
            return;
          }
          iVar12 = ZvgENC.xMinClip - xLen;
          if (0 < iVar12) {
            xLen = iVar12 + xLen;
            xSign = xSign - iVar12;
          }
          if (((bVar8 & 0x80) != 0) && (iVar12 = xEnd_local - ZvgENC.xMaxClip, 0 < iVar12)) {
            xEnd_local = xEnd_local - iVar12;
            xSign = xSign - iVar12;
          }
        }
        else {
          if ((int)xLen < ZvgENC.xMinClip) {
            return;
          }
          if (ZvgENC.xMaxClip < xEnd_local) {
            return;
          }
          iVar12 = xLen - ZvgENC.xMaxClip;
          if (0 < iVar12) {
            xLen = xLen - iVar12;
            xSign = xSign - iVar12;
          }
          if (((bVar8 & 0x80) != 0) && (iVar12 = ZvgENC.xMinClip - xEnd_local, 0 < iVar12)) {
            xEnd_local = iVar12 + xEnd_local;
            xSign = xSign - iVar12;
          }
        }
        if (xSign == 0) {
          zvgEncPointSK(xEnd_local,yEnd_local,ZvgENC.encColor);
          return;
        }
        if ((ZvgENC.encFlags & 4) != 0) {
          if (xEnd_local < ZvgENC.xMinSpot) {
            ZvgENC.xMinSpot = xEnd_local;
          }
          if (ZvgENC.xMaxSpot < xEnd_local) {
            ZvgENC.xMaxSpot = xEnd_local;
          }
          if ((int)xLen < ZvgENC.xMinSpot) {
            ZvgENC.xMinSpot = xLen;
          }
          if (ZvgENC.xMaxSpot < (int)xLen) {
            ZvgENC.xMaxSpot = xLen;
          }
          if (yEnd_local < ZvgENC.yMinSpot) {
            ZvgENC.yMinSpot = yEnd_local;
          }
          if (ZvgENC.yMaxSpot < yEnd_local) {
            ZvgENC.yMaxSpot = yEnd_local;
          }
        }
        if (xSign < 0x100) {
          bVar8 = bVar8 | 0x20;
        }
        uVar13 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar13] = bVar8 | 4 | bVar5;
        if ((bVar8 & 0x40) != 0) {
          uVar13 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar13] = (uchar)(ZvgENC.encColor >> 8);
          uVar13 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar13] = (uchar)ZvgENC.encColor;
        }
        if ((bVar8 & 0x80) != 0) {
          uVar13 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar13] = (uchar)xEnd_local;
          uVar13 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar13] = (byte)(xEnd_local >> 4) & 0xf0 | bVar3 & 0xf;
          uVar13 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar13] = uVar7;
        }
        if ((bVar8 & 0x20) == 0) {
          uVar13 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar13] = (byte)(xSign >> 8) & 0xf;
          uVar13 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar13] = (uchar)xSign;
        }
        else {
          uVar13 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar13] = (uchar)xSign;
        }
      }
      else {
        uVar9 = (uchar)xEnd_local;
        bVar4 = (byte)(xEnd_local >> 4);
        if (xSign == 0) {
          if (xEnd_local < ZvgENC.xMinClip) {
            return;
          }
          if (ZvgENC.xMaxClip < xEnd_local) {
            return;
          }
          if (bVar6) {
            if (ZvgENC.yMaxClip < (int)yLen) {
              return;
            }
            if (yEnd_local < ZvgENC.yMinClip) {
              return;
            }
            iVar12 = ZvgENC.yMinClip - yLen;
            if (0 < iVar12) {
              yLen = iVar12 + yLen;
              ySign = ySign - iVar12;
            }
            if (((bVar8 & 0x80) != 0) && (iVar12 = yEnd_local - ZvgENC.yMaxClip, 0 < iVar12)) {
              yEnd_local = yEnd_local - iVar12;
              ySign = ySign - iVar12;
            }
          }
          else {
            if ((int)yLen < ZvgENC.yMinClip) {
              return;
            }
            if (ZvgENC.yMaxClip < yEnd_local) {
              return;
            }
            iVar12 = yLen - ZvgENC.yMaxClip;
            if (0 < iVar12) {
              yLen = yLen - iVar12;
              ySign = ySign - iVar12;
            }
            if (((bVar8 & 0x80) != 0) && (iVar12 = ZvgENC.yMinClip - yEnd_local, 0 < iVar12)) {
              yEnd_local = iVar12 + yEnd_local;
              ySign = ySign - iVar12;
            }
          }
          if (ySign == 0) {
            zvgEncPointSK(xEnd_local,yEnd_local,ZvgENC.encColor);
            return;
          }
          if ((ZvgENC.encFlags & 4) != 0) {
            if (xEnd_local < ZvgENC.xMinSpot) {
              ZvgENC.xMinSpot = xEnd_local;
            }
            if (ZvgENC.xMaxSpot < xEnd_local) {
              ZvgENC.xMaxSpot = xEnd_local;
            }
            if (yEnd_local < ZvgENC.yMinSpot) {
              ZvgENC.yMinSpot = yEnd_local;
            }
            if (ZvgENC.yMaxSpot < yEnd_local) {
              ZvgENC.yMaxSpot = yEnd_local;
            }
            if ((int)yLen < ZvgENC.yMinSpot) {
              ZvgENC.yMinSpot = yLen;
            }
            if (ZvgENC.yMaxSpot < (int)yLen) {
              ZvgENC.yMaxSpot = yLen;
            }
          }
          if (ySign < 0x100) {
            bVar8 = bVar8 | 0x20;
          }
          uVar13 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar13] = bVar8 | 6 | bVar6;
          if ((bVar8 & 0x40) != 0) {
            uVar13 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar13] = (uchar)(ZvgENC.encColor >> 8);
            uVar13 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar13] = (uchar)ZvgENC.encColor;
          }
          if ((bVar8 & 0x80) != 0) {
            uVar13 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar13] = uVar9;
            uVar13 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar13] = bVar4 & 0xf0 | (byte)((uint)yEnd_local >> 8) & 0xf;
            uVar13 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar13] = (uchar)yEnd_local;
          }
          if ((bVar8 & 0x20) == 0) {
            uVar13 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar13] = (byte)(ySign >> 8) & 0xf;
            uVar13 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar13] = (uchar)ySign;
          }
          else {
            uVar13 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar13] = (uchar)ySign;
          }
        }
        else {
          bVar2 = (byte)(xSign >> 8);
          uVar10 = (uchar)xSign;
          if (ySign == xSign) {
            if ((ZvgENC.encFlags & 4) != 0) {
              if (xEnd_local < ZvgENC.xMinSpot) {
                ZvgENC.xMinSpot = xEnd_local;
              }
              if (ZvgENC.xMaxSpot < xEnd_local) {
                ZvgENC.xMaxSpot = xEnd_local;
              }
              if ((int)xLen < ZvgENC.xMinSpot) {
                ZvgENC.xMinSpot = xLen;
              }
              if (ZvgENC.xMaxSpot < (int)xLen) {
                ZvgENC.xMaxSpot = xLen;
              }
              if (yEnd_local < ZvgENC.yMinSpot) {
                ZvgENC.yMinSpot = yEnd_local;
              }
              if (ZvgENC.yMaxSpot < yEnd_local) {
                ZvgENC.yMaxSpot = yEnd_local;
              }
              if ((int)yLen < ZvgENC.yMinSpot) {
                ZvgENC.yMinSpot = yLen;
              }
              if (ZvgENC.yMaxSpot < (int)yLen) {
                ZvgENC.yMaxSpot = yLen;
              }
            }
            if (xSign < 0x100) {
              bVar8 = bVar8 | 0x20;
            }
            uVar13 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar13] = bVar8 | bVar5 << 1 | bVar6;
            if ((bVar8 & 0x40) != 0) {
              uVar13 = (ulong)ZvgENC.encCount;
              ZvgENC.encCount = ZvgENC.encCount + 1;
              ZvgENC.encBfr[uVar13] = (uchar)(ZvgENC.encColor >> 8);
              uVar13 = (ulong)ZvgENC.encCount;
              ZvgENC.encCount = ZvgENC.encCount + 1;
              ZvgENC.encBfr[uVar13] = (uchar)ZvgENC.encColor;
            }
            if ((bVar8 & 0x80) != 0) {
              uVar13 = (ulong)ZvgENC.encCount;
              ZvgENC.encCount = ZvgENC.encCount + 1;
              ZvgENC.encBfr[uVar13] = uVar9;
              uVar13 = (ulong)ZvgENC.encCount;
              ZvgENC.encCount = ZvgENC.encCount + 1;
              ZvgENC.encBfr[uVar13] = bVar4 & 0xf0 | bVar3 & 0xf;
              uVar13 = (ulong)ZvgENC.encCount;
              ZvgENC.encCount = ZvgENC.encCount + 1;
              ZvgENC.encBfr[uVar13] = uVar7;
            }
            if ((bVar8 & 0x20) == 0) {
              uVar13 = (ulong)ZvgENC.encCount;
              ZvgENC.encCount = ZvgENC.encCount + 1;
              ZvgENC.encBfr[uVar13] = bVar2 & 0xf;
              uVar13 = (ulong)ZvgENC.encCount;
              ZvgENC.encCount = ZvgENC.encCount + 1;
              ZvgENC.encBfr[uVar13] = uVar10;
            }
            else {
              uVar13 = (ulong)ZvgENC.encCount;
              ZvgENC.encCount = ZvgENC.encCount + 1;
              ZvgENC.encBfr[uVar13] = uVar10;
            }
          }
          else {
            if ((ZvgENC.encFlags & 4) != 0) {
              if (xEnd_local < ZvgENC.xMinSpot) {
                ZvgENC.xMinSpot = xEnd_local;
              }
              if (ZvgENC.xMaxSpot < xEnd_local) {
                ZvgENC.xMaxSpot = xEnd_local;
              }
              if ((int)xLen < ZvgENC.xMinSpot) {
                ZvgENC.xMinSpot = xLen;
              }
              if (ZvgENC.xMaxSpot < (int)xLen) {
                ZvgENC.xMaxSpot = xLen;
              }
              if (yEnd_local < ZvgENC.yMinSpot) {
                ZvgENC.yMinSpot = yEnd_local;
              }
              if (ZvgENC.yMaxSpot < yEnd_local) {
                ZvgENC.yMaxSpot = yEnd_local;
              }
              if ((int)yLen < ZvgENC.yMinSpot) {
                ZvgENC.yMinSpot = yLen;
              }
              if (ZvgENC.yMaxSpot < (int)yLen) {
                ZvgENC.yMaxSpot = yLen;
              }
            }
            bVar11 = bVar8 | 8;
            if (ySign < xSign) {
              auVar1 = (ZEXT416(ySign) << 0x10) / ZEXT416(xSign);
              if (xSign < 0x80) {
                bVar11 = bVar8 | 0x28;
              }
              uVar13 = (ulong)ZvgENC.encCount;
              ZvgENC.encCount = ZvgENC.encCount + 1;
              ZvgENC.encBfr[uVar13] = bVar11 | bVar5 << 1 | bVar6;
              if ((bVar11 & 0x40) != 0) {
                uVar13 = (ulong)ZvgENC.encCount;
                ZvgENC.encCount = ZvgENC.encCount + 1;
                ZvgENC.encBfr[uVar13] = (uchar)(ZvgENC.encColor >> 8);
                uVar13 = (ulong)ZvgENC.encCount;
                ZvgENC.encCount = ZvgENC.encCount + 1;
                ZvgENC.encBfr[uVar13] = (uchar)ZvgENC.encColor;
              }
              if ((bVar11 & 0x80) != 0) {
                uVar13 = (ulong)ZvgENC.encCount;
                ZvgENC.encCount = ZvgENC.encCount + 1;
                ZvgENC.encBfr[uVar13] = uVar9;
                uVar13 = (ulong)ZvgENC.encCount;
                ZvgENC.encCount = ZvgENC.encCount + 1;
                ZvgENC.encBfr[uVar13] = bVar4 & 0xf0 | bVar3 & 0xf;
                uVar13 = (ulong)ZvgENC.encCount;
                ZvgENC.encCount = ZvgENC.encCount + 1;
                ZvgENC.encBfr[uVar13] = uVar7;
              }
              uVar7 = auVar1[1];
              if ((bVar11 & 0x20) == 0) {
                uVar13 = (ulong)ZvgENC.encCount;
                ZvgENC.encCount = ZvgENC.encCount + 1;
                ZvgENC.encBfr[uVar13] = uVar7;
                uVar13 = (ulong)ZvgENC.encCount;
                ZvgENC.encCount = ZvgENC.encCount + 1;
                ZvgENC.encBfr[uVar13] = auVar1[0] & 0xf0 | bVar2 & 0xf;
                uVar13 = (ulong)ZvgENC.encCount;
                ZvgENC.encCount = ZvgENC.encCount + 1;
                ZvgENC.encBfr[uVar13] = uVar10;
              }
              else {
                uVar13 = (ulong)ZvgENC.encCount;
                ZvgENC.encCount = ZvgENC.encCount + 1;
                ZvgENC.encBfr[uVar13] = uVar7;
                uVar13 = (ulong)ZvgENC.encCount;
                ZvgENC.encCount = ZvgENC.encCount + 1;
                ZvgENC.encBfr[uVar13] = uVar10;
              }
            }
            else {
              uVar13 = ((ulong)xSign << 0x10) / (ulong)ySign;
              if (ySign < 0x80) {
                bVar11 = bVar8 | 0x28;
              }
              uVar14 = (ulong)ZvgENC.encCount;
              ZvgENC.encCount = ZvgENC.encCount + 1;
              ZvgENC.encBfr[uVar14] = bVar11 | 4 | bVar5 << 1 | bVar6;
              if ((bVar11 & 0x40) != 0) {
                uVar14 = (ulong)ZvgENC.encCount;
                ZvgENC.encCount = ZvgENC.encCount + 1;
                ZvgENC.encBfr[uVar14] = (uchar)(ZvgENC.encColor >> 8);
                uVar14 = (ulong)ZvgENC.encCount;
                ZvgENC.encCount = ZvgENC.encCount + 1;
                ZvgENC.encBfr[uVar14] = (uchar)ZvgENC.encColor;
              }
              if ((bVar11 & 0x80) != 0) {
                uVar14 = (ulong)ZvgENC.encCount;
                ZvgENC.encCount = ZvgENC.encCount + 1;
                ZvgENC.encBfr[uVar14] = uVar9;
                uVar14 = (ulong)ZvgENC.encCount;
                ZvgENC.encCount = ZvgENC.encCount + 1;
                ZvgENC.encBfr[uVar14] = bVar4 & 0xf0 | bVar3 & 0xf;
                uVar14 = (ulong)ZvgENC.encCount;
                ZvgENC.encCount = ZvgENC.encCount + 1;
                ZvgENC.encBfr[uVar14] = uVar7;
              }
              uVar7 = (uchar)(uVar13 >> 8);
              if ((bVar11 & 0x20) == 0) {
                uVar14 = (ulong)ZvgENC.encCount;
                ZvgENC.encCount = ZvgENC.encCount + 1;
                ZvgENC.encBfr[uVar14] = uVar7;
                uVar14 = (ulong)ZvgENC.encCount;
                ZvgENC.encCount = ZvgENC.encCount + 1;
                ZvgENC.encBfr[uVar14] = (byte)uVar13 & 0xf0 | (byte)(ySign >> 8) & 0xf;
                uVar13 = (ulong)ZvgENC.encCount;
                ZvgENC.encCount = ZvgENC.encCount + 1;
                ZvgENC.encBfr[uVar13] = (uchar)ySign;
              }
              else {
                uVar13 = (ulong)ZvgENC.encCount;
                ZvgENC.encCount = ZvgENC.encCount + 1;
                ZvgENC.encBfr[uVar13] = uVar7;
                uVar13 = (ulong)ZvgENC.encCount;
                ZvgENC.encCount = ZvgENC.encCount + 1;
                ZvgENC.encBfr[uVar13] = (uchar)ySign;
              }
            }
          }
        }
      }
      ZvgENC.xPos = xLen;
      ZvgENC.yPos = yLen;
      ZvgENC.zColor = ZvgENC.encColor;
    }
  }
  return;
}

Assistant:

void zvgEnc( int xStart, int yStart, int xEnd, int yEnd)
{
	uint	xLen, yLen;
	uint	xSign, ySign, vRatio;
	uint	zvgCmd;
	int	diff;

	ZvgENC.vecCount++;						// count number of vectors

	// check for axis flips

	if (ZvgENC.encFlags & ENCF_FLIPX)
	{	xStart = ~xStart;
		xEnd = ~xEnd;
	}

	if (ZvgENC.encFlags & ENCF_FLIPY)
	{	yStart = ~yStart;
		yEnd = ~yEnd;
	}

	// Check if NOT a point, vertical or horizontal line, then
	// clip the line the old fashion way.

	if (xStart != xEnd && yStart != yEnd)
		if (!clipLine( &xStart, &yStart, &xEnd, &yEnd))
			return;								// if vector rejected, just return

	// Check for point

	if (xStart == xEnd && yStart == yEnd)
	{
		// clip data point

		if (xStart < ZvgENC.xMinClip)
			return;								// do nothing if outside window

		if (xStart > ZvgENC.xMaxClip)
			return;								// do nothing if outside window

		if (yStart < ZvgENC.yMinClip)
			return;								// do nothing if outside window

		if (yStart > ZvgENC.yMaxClip)
			return;								// do nothing if outside window

		// encode data point
		zvgEncPointSK( xStart, yStart, ZvgENC.encColor);
		return;
	}

	// Handle vectors.

	zvgCmd = zbVECTOR;						// indicate a vector is being drawn

	// Check to see if color has changed

	if (ZvgENC.encColor != ZvgENC.zColor)
		zvgCmd |= zbCOLOR;					// indicate color information is to be sent

	// Check to see if start of this vector is same as current trace position
	// (if start point is the same a previous, then it does not need to be clipped)

	if (xStart != ZvgENC.xPos || yStart != ZvgENC.yPos)
		zvgCmd |= zbABS;						// if not, the starting points must be sent

	// get direction of X and Y axis, and their respective lengths

	if (xEnd < xStart)
	{	xSign = 1;								// moves from right to left
		xLen = xStart - xEnd;				// get length of X axis
	}
	else
	{	xSign = 0;								// moves from left to right
		xLen = xEnd - xStart;				// get length of X axis
	}

	if (yEnd < yStart)
	{	ySign = 1;								// moves downward
		yLen = yStart - yEnd;				// get length of Y axis
	}
	else
	{	ySign = 0;	 							// moves upward
		yLen = yEnd - yStart;				// get length of Y axis
	}

	// check for horizontal line

	if (yLen == 0)
	{
		// clip vector if needed

		if (yStart < ZvgENC.yMinClip || yStart > ZvgENC.yMaxClip)
			return; 						// reject vector

		// Does vector move from right to left?

		if (xSign)
		{
			if (xEnd > ZvgENC.xMaxClip || xStart < ZvgENC.xMinClip)
				return;					// reject vector

			diff = ZvgENC.xMinClip - xEnd;

			if (diff > 0)
			{	xEnd += diff;			// clip line
				xLen -= diff;
			}

			// if new starting points sent, they must be clipped

			if (zvgCmd & zbABS)
			{
				diff = xStart - ZvgENC.xMaxClip;

				if (diff > 0)
				{	xStart -= diff;	// clip line
					xLen -= diff;
				}
			}
		}

		// Else, vector moves from left to right

		else
		{
			if (xEnd < ZvgENC.xMinClip || xStart > ZvgENC.xMaxClip)
				return;					// reject vector

			diff = xEnd - ZvgENC.xMaxClip;

			if (diff > 0)
			{	xEnd -= diff;			// clip line
				xLen -= diff;
			}

			// if new starting points sent, they must be clipped

			if (zvgCmd & zbABS)
			{
				diff = ZvgENC.xMinClip - xStart;

				if (diff > 0)
				{	xStart += diff;	// clip line
					xLen -= diff;
				}
			}
		}

		// check if vector clipped to a point, if so, encode point

		if (xLen == 0)
		{	zvgEncPointSK( xStart, yStart, ZvgENC.encColor);
			return;						// done sending point, return
		}

		if (ZvgENC.encFlags & ENCF_SPOTKILL)
		{
			CHECK_X_SPOT( xStart)
			CHECK_X_SPOT( xEnd)
			CHECK_Y_SPOT( yStart)
		}

		// if length fits in 8 bits, use short version of command

		if (xLen < 256)
			zvgCmd |= zbSHORT;			// use short length

		// send command

		ZvgENC.encBfr[ZvgENC.encCount++] = zvgCmd | zbHZVT | xSign;

		// send color if needed

		if (zvgCmd & zbCOLOR)
			sendColor( ZvgENC.encColor);

		// send starting positions if needed

		if (zvgCmd & zbABS)
			sendXY( xStart, yStart);

		// send length, short or long

		if (zvgCmd & zbSHORT)
			sendLen8( xLen);
	
		else
			sendLen12( xLen);
	}

	// check for vertical line

	else if (xLen == 0)
	{
		// clip vector if needed

		if (xStart < ZvgENC.xMinClip || xStart > ZvgENC.xMaxClip)
			return; 						// reject vector

		// Does vector move downward?

		if (ySign)
		{
			if (yEnd > ZvgENC.yMaxClip || yStart < ZvgENC.yMinClip)
				return;					// reject vector

			diff = ZvgENC.yMinClip - yEnd;

			if (diff > 0)
			{	yEnd += diff;			// clip line
				yLen -= diff;
			}

			// if new starting points sent, they must be clipped

			if (zvgCmd & zbABS)
			{
				diff = yStart - ZvgENC.yMaxClip;

				if (diff > 0)
				{	yStart -= diff;	// clip line
					yLen -= diff;
				}
			}
		}

		// Else, vector moves upward

		else
		{
			if (yEnd < ZvgENC.yMinClip || yStart > ZvgENC.yMaxClip)
				return;					// reject vector

			diff = yEnd - ZvgENC.yMaxClip;

			if (diff > 0)
			{	yEnd -= diff;			// clip line
				yLen -= diff;
			}

			// if new starting points sent, they must be clipped

			if (zvgCmd & zbABS)
			{
				diff = ZvgENC.yMinClip - yStart;

				if (diff > 0)
				{	yStart += diff;	// clip line
					yLen -= diff;
				}
			}
		}

		// check if vector clipped to a point, if so, encode point

		if (yLen == 0)
		{	zvgEncPointSK( xStart, yStart, ZvgENC.encColor);
			return;						// done sending point, return
		}

		if (ZvgENC.encFlags & ENCF_SPOTKILL)
		{
			CHECK_X_SPOT( xStart)
			CHECK_Y_SPOT( yStart)
			CHECK_Y_SPOT( yEnd)
		}

		// if length fits in 8 bits, use short version of command

		if (yLen < 256)
			zvgCmd |= zbSHORT;			// use short length

		// send command

		ZvgENC.encBfr[ZvgENC.encCount++] = zvgCmd | zbHZVT | zbVERT | ySign;

		// send color if needed

		if (zvgCmd & zbCOLOR)		
			sendColor( ZvgENC.encColor);

		// send starting positions if needed

		if (zvgCmd & zbABS)
			sendXY( xStart, yStart);

		// send length, short or long

		if (zvgCmd & zbSHORT)
			sendLen8( yLen);
	
		else
			sendLen12( yLen);
	}

	// look for 45 degree angle

	else if (yLen == xLen)
	{
		// spot kill test

		if (ZvgENC.encFlags & ENCF_SPOTKILL)
		{
			CHECK_X_SPOT( xStart)
			CHECK_X_SPOT( xEnd)
			CHECK_Y_SPOT( yStart)
			CHECK_Y_SPOT( yEnd)
		}

		// if length fits in 8 bits, send short length

		if (xLen < 256)
			zvgCmd |= zbSHORT;				// use short length

		// send ZVG command, and direction

		ZvgENC.encBfr[ZvgENC.encCount++] = zvgCmd | (xSign << 1) | ySign;

		if (zvgCmd & zbCOLOR)
			sendColor( ZvgENC.encColor);

		// if starting points required, send them

		if (zvgCmd & zbABS)
			sendXY( xStart, yStart);

		// if short length, send it

		if (zvgCmd & zbSHORT)
			sendLen8( xLen);
	
		// else, send long length

		else
			sendLen12( xLen);
	}

	// If not 45 degree angle, vertical, or horizontal, then ratio must be
	// calculated.

	else
	{
		// spot kill test

		if (ZvgENC.encFlags & ENCF_SPOTKILL)
		{
			CHECK_X_SPOT( xStart)
			CHECK_X_SPOT( xEnd)
			CHECK_Y_SPOT( yStart)
			CHECK_Y_SPOT( yEnd)
		}

		zvgCmd |= zbRATIO;					// indicate ratio being sent

		if (xLen > yLen)
		{
			// calculate integer ratio

			vRatio = (uint)(((ulong)yLen << 16) / xLen);

			// if length can fit in 7 bits, send short version of command

			if (xLen < 128)
				zvgCmd |= zbSHORT;			// use short length

			// send command

			ZvgENC.encBfr[ZvgENC.encCount++] = zvgCmd | (xSign << 1) | ySign;

			// send color if needed
		
			if (zvgCmd & zbCOLOR)
				sendColor( ZvgENC.encColor);

			// send start positions if needed

			if (zvgCmd & zbABS)
				sendXY( xStart, yStart);

			// send length and ratio, short or long

			if (zvgCmd & zbSHORT)
				sendRatioLen8( vRatio, xLen);
	
			else
				sendRatioLen12( vRatio, xLen);
		}

		// Else, Y length is greater than X length.

		else
		{
			// calculate ratio

			vRatio = (unsigned int)(((long)xLen << 16) / yLen);

			// if length can fit in 7 bits, send short version of command

			if (yLen < 128)
				zvgCmd |= zbSHORT;			// use short length

			// send command

			ZvgENC.encBfr[ZvgENC.encCount++] = zvgCmd | zbYLEN | (xSign << 1) | ySign;

			// send color if needed
		
			if (zvgCmd & zbCOLOR)
				sendColor( ZvgENC.encColor);

			// send start positions if needed

			if (zvgCmd & zbABS)
				sendXY( xStart, yStart);

			// send length and ratio, short or long

			if (zvgCmd & zbSHORT)
				sendRatioLen8( vRatio, yLen);
	
			else
				sendRatioLen12( vRatio, yLen);
		}
	}
	ZvgENC.xPos = xEnd;						// new position is end of vector
	ZvgENC.yPos = yEnd;
	ZvgENC.zColor = ZvgENC.encColor;		// save new color
}